

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O3

char * string_strnstr(char *s,char *find,size_t slen)

{
  char cVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  
  cVar1 = *find;
  if (cVar1 != '\0') {
    __n = strlen(find + 1);
    uVar3 = slen - 1;
    while (*s != '\0') {
      if (uVar3 == 0xffffffffffffffff) {
        return (char *)0x0;
      }
      if (*s == cVar1) {
        if (uVar3 < __n) break;
        iVar2 = strncmp(s + 1,find + 1,__n);
        if (iVar2 == 0) {
          return s;
        }
      }
      uVar3 = uVar3 - 1;
      s = s + 1;
    }
    s = (char *)0x0;
  }
  return s;
}

Assistant:

char *string_strnstr(const char *s, const char *find, size_t slen) {
    char c, sc;
    size_t len;
    
    if ((c = *find++) != '\0') {
        len = strlen(find);
        do {
            do {
                if ((sc = *s++) == '\0' || slen-- < 1)
                    return (NULL);
            } while (sc != c);
            if (len > slen)
                return (NULL);
        } while (strncmp(s, find, len) != 0);
        s--;
    }
    return ((char *)s);
}